

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O0

void yin_print_grouping(lyout *out,int level,lys_node *node)

{
  lys_node_grp *grp;
  lys_node *sub;
  int content;
  int i;
  lys_node *node_local;
  lyout *plStack_10;
  int level_local;
  lyout *out_local;
  
  sub._0_4_ = 0;
  _content = node;
  node_local._4_4_ = level;
  plStack_10 = out;
  yin_print_open(out,level,(char *)0x0,"grouping","name",node->name,0);
  node_local._4_4_ = node_local._4_4_ + 1;
  yin_print_snode_common(plStack_10,node_local._4_4_,_content,_content->module,(int *)&sub,0x71);
  for (sub._4_4_ = 0; sub._4_4_ < (int)(uint)node->padding[3]; sub._4_4_ = sub._4_4_ + 1) {
    yin_print_close_parent(plStack_10,(int *)&sub);
    yin_print_typedef(plStack_10,node_local._4_4_,_content->module,
                      (lys_tpdf *)(node[1].name + (long)sub._4_4_ * 0x80));
  }
  for (grp = (lys_node_grp *)_content->child; grp != (lys_node_grp *)0x0;
      grp = (lys_node_grp *)grp->next) {
    yin_print_close_parent(plStack_10,(int *)&sub);
    yin_print_snode(plStack_10,node_local._4_4_,(lys_node *)grp,0x800);
  }
  for (grp = (lys_node_grp *)_content->child; grp != (lys_node_grp *)0x0;
      grp = (lys_node_grp *)grp->next) {
    yin_print_close_parent(plStack_10,(int *)&sub);
    yin_print_snode(plStack_10,node_local._4_4_,(lys_node *)grp,0x903f);
  }
  for (grp = (lys_node_grp *)_content->child; grp != (lys_node_grp *)0x0;
      grp = (lys_node_grp *)grp->next) {
    yin_print_close_parent(plStack_10,(int *)&sub);
    yin_print_snode(plStack_10,node_local._4_4_,(lys_node *)grp,0x4000);
  }
  for (grp = (lys_node_grp *)_content->child; grp != (lys_node_grp *)0x0;
      grp = (lys_node_grp *)grp->next) {
    yin_print_close_parent(plStack_10,(int *)&sub);
    yin_print_snode(plStack_10,node_local._4_4_,(lys_node *)grp,0x80);
  }
  node_local._4_4_ = node_local._4_4_ + -1;
  yin_print_close(plStack_10,node_local._4_4_,(char *)0x0,"grouping",(int)sub);
  return;
}

Assistant:

static void
yin_print_grouping(struct lyout *out, int level, const struct lys_node *node)
{
    int i, content = 0;
    struct lys_node *sub;
    struct lys_node_grp *grp = (struct lys_node_grp *)node;

    yin_print_open(out, level, NULL, "grouping", "name", node->name, content);
    level++;

    yin_print_snode_common(out, level, node, node->module, &content, SNODE_COMMON_EXT | SNODE_COMMON_STATUS |
                           SNODE_COMMON_DSC | SNODE_COMMON_REF);

    for (i = 0; i < grp->tpdf_size; i++) {
        yin_print_close_parent(out, &content);
        yin_print_typedef(out, level, node->module, &grp->tpdf[i]);
    }

    LY_TREE_FOR(node->child, sub) {
        yin_print_close_parent(out, &content);
        yin_print_snode(out, level, sub, LYS_GROUPING);
    }

    LY_TREE_FOR(node->child, sub) {
        yin_print_close_parent(out, &content);
        yin_print_snode(out, level, sub, LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST |
                         LYS_USES | LYS_ANYDATA);
    }

    LY_TREE_FOR(node->child, sub) {
        yin_print_close_parent(out, &content);
        yin_print_snode(out, level, sub, LYS_ACTION);
    }

    LY_TREE_FOR(node->child, sub) {
        yin_print_close_parent(out, &content);
        yin_print_snode(out, level, sub, LYS_NOTIF);
    }

    level--;
    yin_print_close(out, level, NULL, "grouping", content);
}